

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcher.cpp
# Opt level: O3

bool __thiscall
cbtCollisionDispatcher::needsCollision
          (cbtCollisionDispatcher *this,cbtCollisionObject *body0,cbtCollisionObject *body1)

{
  int iVar1;
  
  if ((body0->m_activationState1 == 5) || (body0->m_activationState1 == 2)) {
    if (body1->m_activationState1 == 2) {
      return false;
    }
    if (body1->m_activationState1 == 5) {
      return false;
    }
  }
  if ((body0->m_checkCollideWith == 0) ||
     (iVar1 = (*body0->_vptr_cbtCollisionObject[3])(body0,body1), (char)iVar1 != '\0')) {
    if (body1->m_checkCollideWith == 0) {
      return true;
    }
    iVar1 = (*body1->_vptr_cbtCollisionObject[3])(body1,body0);
    if ((char)iVar1 != '\0') {
      return true;
    }
  }
  return false;
}

Assistant:

bool cbtCollisionDispatcher::needsCollision(const cbtCollisionObject* body0, const cbtCollisionObject* body1)
{
	cbtAssert(body0);
	cbtAssert(body1);

	bool needsCollision = true;

#ifdef BT_DEBUG
	if (!(m_dispatcherFlags & cbtCollisionDispatcher::CD_STATIC_STATIC_REPORTED))
	{
		//broadphase filtering already deals with this
		if (body0->isStaticOrKinematicObject() && body1->isStaticOrKinematicObject())
		{
			m_dispatcherFlags |= cbtCollisionDispatcher::CD_STATIC_STATIC_REPORTED;
			printf("warning cbtCollisionDispatcher::needsCollision: static-static collision!\n");
		}
	}
#endif  //BT_DEBUG

	if ((!body0->isActive()) && (!body1->isActive()))
		needsCollision = false;
	else if ((!body0->checkCollideWith(body1)) || (!body1->checkCollideWith(body0)))
		needsCollision = false;

	return needsCollision;
}